

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

jsgf_rule_t * jsgf_import_rule(jsgf_t *jsgf,char *name)

{
  glist_t pgVar1;
  jsgf_rule_t *val_00;
  hash_table_t *h;
  int iVar2;
  int32 iVar3;
  size_t sVar4;
  char *__dest;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  FILE *__stream;
  jsgf_t *val_01;
  hash_iter_t *itor;
  char *pcVar8;
  char *orig;
  jsgf_rule_t *pjVar9;
  long ln;
  glist_t *ppgVar10;
  bool bVar11;
  void *val;
  char *local_38;
  
  sVar4 = strlen(name);
  __dest = (char *)__ckd_malloc__(sVar4 + 4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                  ,0x2c6);
  strcpy(__dest,name + 1);
  pcVar5 = strrchr(__dest,0x2e);
  if (pcVar5 != (char *)0x0) {
    *pcVar5 = '\0';
    sVar6 = strlen(name);
    pcVar7 = __dest;
    if (sVar6 < 3) {
      bVar11 = false;
    }
    else {
      iVar2 = strcmp(name + (sVar4 - 3),".*>");
      bVar11 = iVar2 == 0;
    }
    do {
      if (*pcVar7 == '.') {
        *pcVar7 = '/';
      }
      else if (*pcVar7 == '\0') goto LAB_0012ab20;
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  pcVar5 = "Imported rule is not qualified: %s\n";
  ln = 0x2cb;
  goto LAB_0012ac60;
LAB_0012ab20:
  sVar4 = strlen(__dest);
  builtin_strncpy(__dest + sVar4,".gram",6);
  ppgVar10 = &jsgf->searchpath;
  while (pgVar1 = *ppgVar10, pgVar1 != (glist_t)0x0) {
    pcVar7 = string_join((char *)(pgVar1->data).ptr,"/",__dest,0);
    __stream = fopen(pcVar7,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      if (pcVar7 != (char *)0x0) {
        ckd_free(__dest);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                ,0x2e4,"Importing %s from %s to %s\n",name,pcVar7,jsgf->name);
        iVar3 = hash_table_lookup(jsgf->imports,pcVar7,&val);
        if (iVar3 == 0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                  ,0x2ea,"Already imported %s\n",pcVar7);
          val_01 = (jsgf_t *)val;
          ckd_free(pcVar7);
        }
        else {
          val_01 = jsgf_parse_file(pcVar7,jsgf);
          val = hash_table_enter(jsgf->imports,pcVar7,val_01);
          if ((jsgf_t *)val != val_01) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                    ,0x2f3,"Multiply imported file: %s\n",pcVar7);
          }
        }
        if (val_01 != (jsgf_t *)0x0) {
          itor = hash_table_iter(val_01->rules);
          local_38 = name;
          for (; itor != (hash_iter_t *)0x0; itor = hash_table_iter_next(itor)) {
            val_00 = (jsgf_rule_t *)itor->ent->val;
            pcVar7 = __ckd_salloc__(name,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                    ,0x102);
            pcVar8 = strrchr(pcVar7 + 1,0x2e);
            if (pcVar8 != (char *)0x0) {
              *pcVar8 = '\0';
              orig = strrchr(pcVar7 + 1,0x2e);
              *pcVar8 = '.';
              if (orig != (char *)0x0) {
                *orig = '<';
                pcVar8 = __ckd_salloc__(orig,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                        ,0x10b);
                ckd_free(pcVar7);
                pcVar7 = pcVar8;
              }
            }
            name = local_38;
            if (bVar11) {
              iVar2 = strncmp(pcVar7,val_00->name,(size_t)(pcVar5 + (1 - (long)__dest)));
            }
            else {
              iVar2 = strcmp(pcVar7,val_00->name);
            }
            ckd_free(pcVar7);
            if ((val_00->is_public != 0) && (iVar2 == 0)) {
              pcVar7 = strrchr(val_00->name,0x2e);
              if (pcVar7 == (char *)0x0) {
                __assert_fail("c != NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                              ,0x310,"jsgf_rule_t *jsgf_import_rule(jsgf_t *, char *)");
              }
              pcVar7 = jsgf_fullname(jsgf,pcVar7);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                      ,0x313,"Imported %s\n",pcVar7);
              h = jsgf->rules;
              val_00->refcnt = val_00->refcnt + 1;
              pjVar9 = (jsgf_rule_t *)hash_table_enter(h,pcVar7,val_00);
              if (pjVar9 != val_00) {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                        ,0x317,"Multiply defined symbol: %s\n",pcVar7);
              }
              if (!bVar11) {
                hash_table_iter_free(itor);
                return val_00;
              }
            }
          }
        }
        return (jsgf_rule_t *)0x0;
      }
      break;
    }
    ckd_free(pcVar7);
    ppgVar10 = &pgVar1->next;
  }
  pcVar5 = "Failed to find grammar %s\n";
  ln = 0x2dd;
  name = __dest;
LAB_0012ac60:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
          ,ln,pcVar5,name);
  ckd_free(__dest);
  return (jsgf_rule_t *)0x0;
}

Assistant:

jsgf_rule_t *
jsgf_import_rule(jsgf_t * jsgf, char *name)
{
    char *c, *path, *newpath;
    size_t namelen, packlen;
    void *val;
    jsgf_t *imp;
    int import_all;

    /* Trim the leading and trailing <> */
    namelen = strlen(name);
    path = ckd_malloc(namelen - 2 + 6); /* room for a trailing .gram */
    strcpy(path, name + 1);
    /* Split off the first part of the name */
    c = strrchr(path, '.');
    if (c == NULL) {
        E_ERROR("Imported rule is not qualified: %s\n", name);
        ckd_free(path);
        return NULL;
    }
    packlen = c - path;
    *c = '\0';

    /* Look for import foo.* */
    import_all = (strlen(name) > 2
                  && 0 == strcmp(name + namelen - 3, ".*>"));

    /* Construct a filename. */
    for (c = path; *c; ++c)
        if (*c == '.')
            *c = '/';
    strcat(path, ".gram");
    newpath = path_list_search(jsgf->searchpath, path);
    if (newpath == NULL) {
        E_ERROR("Failed to find grammar %s\n", path);
        ckd_free(path);
        return NULL;
    }
    ckd_free(path);

    path = newpath;
    E_INFO("Importing %s from %s to %s\n", name, path, jsgf->name);

    /* FIXME: Also, we need to make sure that path is fully qualified
     * here, by adding any prefixes from jsgf->name to it. */
    /* See if we have parsed it already */
    if (hash_table_lookup(jsgf->imports, path, &val) == 0) {
        E_INFO("Already imported %s\n", path);
        imp = val;
        ckd_free(path);
    }
    else {
        /* If not, parse it. */
        imp = jsgf_parse_file(path, jsgf);
        val = hash_table_enter(jsgf->imports, path, imp);
        if (val != (void *) imp) {
            E_WARN("Multiply imported file: %s\n", path);
        }
    }
    if (imp != NULL) {
        hash_iter_t *itor;
        /* Look for public rules matching rulename. */
        for (itor = hash_table_iter(imp->rules); itor;
             itor = hash_table_iter_next(itor)) {
            hash_entry_t *he = itor->ent;
            jsgf_rule_t *rule = hash_entry_val(he);
            int rule_matches;
            char *rule_name = importname2rulename(name);

            if (import_all) {
                /* Match package name (symbol table is shared) */
                rule_matches =
                    !strncmp(rule_name, rule->name, packlen + 1);
            }
            else {
                /* Exact match */
                rule_matches = !strcmp(rule_name, rule->name);
            }
            ckd_free(rule_name);
            if (rule->is_public && rule_matches) {
                void *val;
                char *newname;

                /* Link this rule into the current namespace. */
                c = strrchr(rule->name, '.');
                assert(c != NULL);
                newname = jsgf_fullname(jsgf, c);

                E_INFO("Imported %s\n", newname);
                val = hash_table_enter(jsgf->rules, newname,
                                       jsgf_rule_retain(rule));
                if (val != (void *) rule) {
                    E_WARN("Multiply defined symbol: %s\n", newname);
                }
                if (!import_all) {
                    hash_table_iter_free(itor);
                    return rule;
                }
            }
        }
    }

    return NULL;
}